

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
ConvertToStruct(vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct> *this)

{
  bool bVar1;
  undefined1 local_98 [8];
  OutPointStruct data;
  OutPoint *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct> *__range3;
  JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct> *this_local;
  vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> *result;
  
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::vector
            (__return_storage_ptr__);
  __end0 = std::vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::OutPoint>).
                    super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
                  );
  element = (OutPoint *)
            std::vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::OutPoint>).
                   super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::OutPoint_*,_std::vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::OutPoint_*,_std::vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>_>
                 ::operator*(&__end0);
    js::api::json::OutPoint::ConvertToStruct
              ((OutPointStruct *)local_98,
               (OutPoint *)data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::
    push_back(__return_storage_ptr__,(value_type *)local_98);
    js::api::OutPointStruct::~OutPointStruct((OutPointStruct *)local_98);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::OutPoint_*,_std::vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }